

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef lj_opt_cse(jit_State *J)

{
  uint uVar1;
  int iVar2;
  IRIns *pIVar3;
  IRRef2 IVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ulong uVar8;
  
  uVar6 = (J->fold).ins.field_0.op1;
  uVar7 = (J->fold).ins.field_0.op2;
  IVar4 = (J->fold).ins.field_1.op12;
  bVar5 = (J->fold).ins.field_1.o;
  if ((J->flags & 0x20000) != 0) {
    if (uVar6 < uVar7) {
      uVar6 = uVar7;
    }
    uVar7 = J->chain[bVar5];
    if (uVar6 < uVar7) {
      pIVar3 = (J->cur).ir;
      do {
        uVar8 = (ulong)uVar7;
        if (pIVar3[uVar8].field_1.op12 == IVar4) {
          return *(int *)((long)pIVar3 + uVar8 * 8 + 4) << 0x18 | (uint)uVar7;
        }
        uVar7 = *(ushort *)((long)pIVar3 + uVar8 * 8 + 6);
      } while (uVar6 < uVar7);
    }
  }
  uVar1 = (J->cur).nins;
  uVar8 = (ulong)uVar1;
  if (J->irtoplim <= uVar1) {
    lj_ir_growtop(J);
  }
  (J->cur).nins = uVar1 + 1;
  pIVar3 = (J->cur).ir;
  *(IRRef1 *)((long)pIVar3 + uVar8 * 8 + 6) = J->chain[bVar5];
  pIVar3[uVar8].field_1.op12 = IVar4;
  J->chain[bVar5] = (IRRef1)uVar1;
  *(IROp1 *)((long)pIVar3 + uVar8 * 8 + 5) = (J->fold).ins.field_1.o;
  iVar2 = *(int *)((long)&(J->fold).ins + 4);
  bVar5 = (byte)iVar2;
  (J->guardemit).irt = (J->guardemit).irt | bVar5;
  *(byte *)((long)pIVar3 + uVar8 * 8 + 4) = bVar5;
  return iVar2 * 0x1000000 + uVar1;
}

Assistant:

TRef LJ_FASTCALL lj_opt_cse(jit_State *J)
{
  /* Avoid narrow to wide store-to-load forwarding stall */
  IRRef2 op12 = (IRRef2)fins->op1 + ((IRRef2)fins->op2 << 16);
  IROp op = fins->o;
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    /* Limited search for same operands in per-opcode chain. */
    IRRef ref = J->chain[op];
    IRRef lim = fins->op1;
    if (fins->op2 > lim) lim = fins->op2;  /* Relies on lit < REF_BIAS. */
    while (ref > lim) {
      if (IR(ref)->op12 == op12)
	return TREF(ref, irt_t(IR(ref)->t));  /* Common subexpression found. */
      ref = IR(ref)->prev;
    }
  }
  /* Otherwise emit IR (inlined for speed). */
  {
    IRRef ref = lj_ir_nextins(J);
    IRIns *ir = IR(ref);
    ir->prev = J->chain[op];
    ir->op12 = op12;
    J->chain[op] = (IRRef1)ref;
    ir->o = fins->o;
    J->guardemit.irt |= fins->t.irt;
    return TREF(ref, irt_t((ir->t = fins->t)));
  }
}